

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

any * Omega_h::anon_unknown_41::eval_pow(any *__return_storage_ptr__,Int dim,any *lhs,any *rhs)

{
  bool bVar1;
  type_info *ptVar2;
  ParserFail *pPVar3;
  double __y;
  void *pvVar4;
  allocator local_69;
  Write<double> local_68;
  double local_58;
  Write<double> local_50;
  string local_40;
  
  if (dim == 2) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar2 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar2 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
    if (!bVar1) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*rhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
      if (!bVar1) {
        pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_40,"Invalid right operand type in ^ operator",&local_69);
        ParserFail::ParserFail(pPVar3,&local_40);
        __cxa_throw(pPVar3,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      goto LAB_00281a3a;
    }
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_68,lhs);
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_50,rhs);
    pow_each((Omega_h *)&local_40,(Reals *)&local_68,(Reals *)&local_50);
    any::construct<Omega_h::Read<double>>(__return_storage_ptr__,(Read<double> *)&local_40);
  }
  else if (dim == 3) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar2 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar2 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
    if (!bVar1) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*rhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
      if (!bVar1) {
        pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_40,"Invalid right operand type in ^ operator",&local_69);
        ParserFail::ParserFail(pPVar3,&local_40);
        __cxa_throw(pPVar3,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
LAB_00281a3a:
      local_58 = any_cast<double>(lhs);
      __y = any_cast<double>(rhs);
      pvVar4 = (void *)pow(local_58,__y);
      __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<double>()::table;
      (__return_storage_ptr__->storage).dynamic = pvVar4;
      return __return_storage_ptr__;
    }
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_68,lhs);
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_50,rhs);
    pow_each((Omega_h *)&local_40,(Reals *)&local_68,(Reals *)&local_50);
    any::construct<Omega_h::Read<double>>(__return_storage_ptr__,(Read<double> *)&local_40);
  }
  else {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar2 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar2 = (*rhs->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&Read<double>::typeinfo);
    if (!bVar1) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar2 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar2 = (*rhs->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar2,(type_info *)&double::typeinfo);
      if (!bVar1) {
        pPVar3 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_40,"Invalid right operand type in ^ operator",
                   (allocator *)&local_68);
        ParserFail::ParserFail(pPVar3,&local_40);
        __cxa_throw(pPVar3,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      goto LAB_00281a3a;
    }
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_68,lhs);
    any_cast<Omega_h::Read<double>>((Omega_h *)&local_50,rhs);
    pow_each((Omega_h *)&local_40,(Reals *)&local_68,(Reals *)&local_50);
    any::construct<Omega_h::Read<double>>(__return_storage_ptr__,(Read<double> *)&local_40);
  }
  Write<double>::~Write((Write<double> *)&local_40);
  Write<double>::~Write(&local_50);
  Write<double>::~Write(&local_68);
  return __return_storage_ptr__;
}

Assistant:

any eval_pow(Int dim, any& lhs, any& rhs) {
  if (dim == 3) return eval_pow<3>(lhs, rhs);
  if (dim == 2) return eval_pow<2>(lhs, rhs);
  return eval_pow<1>(lhs, rhs);
}